

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateBlockBuilder.cpp
# Opt level: O0

AppStatePtr MakeState_BlockBuilder(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  AppStatePtr AVar1;
  shared_ptr<(anonymous_namespace)::StateBlockBuilder> local_20;
  
  std::make_shared<(anonymous_namespace)::StateBlockBuilder>();
  std::shared_ptr<AppState>::shared_ptr<(anonymous_namespace)::StateBlockBuilder,void>
            ((shared_ptr<AppState> *)in_RDI,&local_20);
  std::shared_ptr<(anonymous_namespace)::StateBlockBuilder>::~shared_ptr(&local_20);
  AVar1.super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  AVar1.super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (AppStatePtr)AVar1.super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AppStatePtr MakeState_BlockBuilder()
{
    return std::make_shared<StateBlockBuilder>();
}